

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_fixed_wnaf_small_helper(int *wnaf,int *wnaf_expected,int w)

{
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int i;
  int local_18;
  
  local_18 = (int)(0x7f / (long)in_EDX);
  while( true ) {
    if (local_18 < 8) {
      local_18 = 7;
      while( true ) {
        if (local_18 < 0) {
          return;
        }
        if (*(int *)(in_RDI + (long)local_18 * 4) != *(int *)(in_RSI + (long)local_18 * 4)) break;
        local_18 = local_18 + -1;
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x14c1,"test condition failed: wnaf[i] == wnaf_expected[i]");
      abort();
    }
    if (*(int *)(in_RDI + (long)local_18 * 4) != 0) break;
    local_18 = local_18 + -1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x14be,"test condition failed: wnaf[i] == 0");
  abort();
}

Assistant:

static void test_fixed_wnaf_small_helper(int *wnaf, int *wnaf_expected, int w) {
    int i;
    for (i = WNAF_SIZE(w)-1; i >= 8; --i) {
        CHECK(wnaf[i] == 0);
    }
    for (i = 7; i >= 0; --i) {
        CHECK(wnaf[i] == wnaf_expected[i]);
    }
}